

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opna.cpp
# Opt level: O0

void __thiscall YmFmOPNA::~YmFmOPNA(YmFmOPNA *this)

{
  ym2608 *this_00;
  long *plVar1;
  void *pvVar2;
  output_data *output_r;
  ymfm_interface_conflict *intf_r;
  ym2608 *chip_r;
  YmFmOPNA *this_local;
  
  if (this->p != (YmFmOPNA_Private *)0x0) {
    operator_delete(this->p,0xfd0);
  }
  this_00 = (ym2608 *)this->m_chip;
  plVar1 = (long *)this->m_intf;
  pvVar2 = this->m_output;
  if (this_00 != (ym2608 *)0x0) {
    ymfm::ym2608::~ym2608(this_00);
    operator_delete(this_00,0xc38);
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x48))();
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,0xc);
  }
  OPNChipBaseT<YmFmOPNA>::~OPNChipBaseT(&this->super_OPNChipBaseT<YmFmOPNA>);
  return;
}

Assistant:

YmFmOPNA::~YmFmOPNA()
{
    delete p;
    ymfm::ym2608 *chip_r = reinterpret_cast<ymfm::ym2608*>(m_chip);
    ymfm::ymfm_interface *intf_r = reinterpret_cast<ymfm::ymfm_interface*>(m_intf);
    ymfm::ym2608::output_data *output_r = reinterpret_cast<ymfm::ym2608::output_data*>(m_output);
    delete chip_r;
    delete intf_r;
    delete output_r;
}